

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int tcptran_listener_init(void *arg,nng_url *url,nni_listener *nlistener)

{
  int iVar1;
  nni_sock *sock_00;
  size_t sVar2;
  nni_sock *sock;
  int rv;
  tcptran_ep *ep;
  nni_listener *nlistener_local;
  nng_url *url_local;
  void *arg_local;
  
  sock_00 = nni_listener_sock(nlistener);
  *(nni_listener **)((long)arg + 0x420) = nlistener;
  tcptran_ep_init((tcptran_ep *)arg,sock_00,tcptran_accept_cb);
  sVar2 = strlen(url->u_path);
  if ((sVar2 == 0) || (iVar1 = strcmp(url->u_path,"/"), iVar1 == 0)) {
    if (((url->u_fragment == (char *)0x0) && (url->u_userinfo == (char *)0x0)) &&
       (url->u_query == (char *)0x0)) {
      arg_local._4_4_ =
           nng_stream_listener_alloc_url((nng_stream_listener **)((long)arg + 0x418),url);
      if (arg_local._4_4_ == 0) {
        nni_listener_add_stat(nlistener,(nni_stat_item *)((long)arg + 0x430));
        arg_local._4_4_ = 0;
      }
    }
    else {
      arg_local._4_4_ = 0xf;
    }
  }
  else {
    arg_local._4_4_ = 0xf;
  }
  return arg_local._4_4_;
}

Assistant:

static int
tcptran_listener_init(void *arg, nng_url *url, nni_listener *nlistener)
{
	tcptran_ep *ep = arg;
	int         rv;
	nni_sock   *sock = nni_listener_sock(nlistener);

	ep->nlistener = nlistener;
	tcptran_ep_init(ep, sock, tcptran_accept_cb);

	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL)) {
		return (NNG_EADDRINVAL);
	}

	if ((rv = nng_stream_listener_alloc_url(&ep->listener, url)) != 0) {
		return (rv);
	}
#ifdef NNG_ENABLE_STATS
	nni_listener_add_stat(nlistener, &ep->st_rcv_max);
#endif

	return (0);
}